

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

void free_StreamsInfo(_7z_stream_info *si)

{
  _7z_stream_info *si_local;
  
  free_PackInfo(&si->pi);
  free_CodersInfo(&si->ci);
  free_SubStreamsInfo(&si->ss);
  return;
}

Assistant:

static void
free_StreamsInfo(struct _7z_stream_info *si)
{
	free_PackInfo(&(si->pi));
	free_CodersInfo(&(si->ci));
	free_SubStreamsInfo(&(si->ss));
}